

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg.cpp
# Opt level: O2

unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> __thiscall
mg::data::MappedMrg::parse(MappedMrg *this,string *hed,shared_ptr<mg::fs::MappedFile> *backing_data)

{
  ulong uVar1;
  pointer pcVar2;
  MappedMrg *this_00;
  ssize_t i;
  ulong uVar3;
  _Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
  local_90;
  undefined1 auStack_78 [8];
  vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
  entries;
  PackedEntryHeader local_58;
  PackedEntryHeader header;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2> *local_40;
  __uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> local_38;
  
  uVar1 = hed->_M_string_length;
  if ((uVar1 & 7) == 0) {
    pcVar2 = (hed->_M_dataplus)._M_p;
    entries.
    super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_78 = (undefined1  [8])0x0;
    entries.
    super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uVar3 = 0;
    local_40 = &backing_data->super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>;
    local_38._M_t.
    super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
    super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl =
         (tuple<mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>)
         (tuple<mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>)this;
    while ((uVar1 >> 3 != uVar3 &&
           (local_58 = *(PackedEntryHeader *)(pcVar2 + uVar3 * 8), local_58.offset != 0xffffffff)))
    {
      std::vector<mg::data::Mrg::PackedEntryHeader,std::allocator<mg::data::Mrg::PackedEntryHeader>>
      ::emplace_back<mg::data::Mrg::PackedEntryHeader&>
                ((vector<mg::data::Mrg::PackedEntryHeader,std::allocator<mg::data::Mrg::PackedEntryHeader>>
                  *)auStack_78,&local_58);
      uVar3 = uVar3 + 1;
    }
    this_00 = (MappedMrg *)operator_new(0x28);
    std::__shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2> *)&header,local_40);
    std::vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
    ::vector((vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
              *)&local_90,
             (vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
              *)auStack_78);
    MappedMrg(this_00,(shared_ptr<mg::fs::MappedFile> *)&header,
              (vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
               *)&local_90);
    this = (MappedMrg *)
           local_38._M_t.
           super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
           super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl;
    *(MappedMrg **)
     local_38._M_t.
     super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
     super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl = this_00;
    std::
    _Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
    ::~_Vector_base(&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    std::
    _Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
    ::~_Vector_base((_Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                     *)auStack_78);
  }
  else {
    fprintf(_stderr,"Wrong size for HED, must be multiple of %lu\n",8);
    (this->_backing_data).super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
  }
  return (__uniq_ptr_data<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>,_true,_true>
         )(tuple<mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>)this;
}

Assistant:

std::unique_ptr<MappedMrg>
MappedMrg::parse(const std::string &hed,
                 std::shared_ptr<mg::fs::MappedFile> backing_data) {
  // Check header size valid
  if (hed.size() % sizeof(Mrg::PackedEntryHeader) != 0) {
    fprintf(stderr, "Wrong size for HED, must be multiple of %lu\n",
            sizeof(Mrg::PackedEntryHeader));
    return nullptr;
  }

  // Reinterpret header
  const ssize_t entry_count = hed.size() / sizeof(Mrg::PackedEntryHeader);
  const Mrg::PackedEntryHeader *raw_entries =
      reinterpret_cast<const Mrg::PackedEntryHeader *>(hed.data());

  // Load entry table
  std::vector<Mrg::PackedEntryHeader> entries;
  for (ssize_t i = 0; i < entry_count; i++) {
    // Copy current header
    Mrg::PackedEntryHeader header = raw_entries[i];

    // Endian swap to host
    header.to_host_order();

    // Is this EOF?
    if (header.offset == 0xFFFF'FFFF) {
      break;
    }

    // Emplace into list
    entries.emplace_back(header);
  }

  return std::unique_ptr<MappedMrg>(new MappedMrg(backing_data, entries));
}